

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O0

vector<deqp::gles31::bb::BlockDataPtr,_std::allocator<deqp::gles31::bb::BlockDataPtr>_> *
deqp::gles31::bb::anon_unknown_11::blockLocationsToPtrs
          (vector<deqp::gles31::bb::BlockDataPtr,_std::allocator<deqp::gles31::bb::BlockDataPtr>_>
           *__return_storage_ptr__,BufferLayout *layout,
          vector<deqp::gles31::bb::(anonymous_namespace)::BlockLocation,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::BlockLocation>_>
          *blockLocations,vector<void_*,_std::allocator<void_*>_> *bufPtrs)

{
  vector<deqp::gles31::bb::(anonymous_namespace)::BlockLocation,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::BlockLocation>_>
  *layout_00;
  size_type sVar1;
  const_reference blockLayout_00;
  const_reference pvVar2;
  const_reference ppvVar3;
  reference pvVar4;
  BlockDataPtr BVar5;
  BlockLocation *location;
  BlockLayoutEntry *blockLayout;
  int blockNdx;
  allocator<deqp::gles31::bb::BlockDataPtr> local_2a;
  undefined1 local_29;
  vector<void_*,_std::allocator<void_*>_> *local_28;
  vector<void_*,_std::allocator<void_*>_> *bufPtrs_local;
  vector<deqp::gles31::bb::(anonymous_namespace)::BlockLocation,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::BlockLocation>_>
  *blockLocations_local;
  BufferLayout *layout_local;
  vector<deqp::gles31::bb::BlockDataPtr,_std::allocator<deqp::gles31::bb::BlockDataPtr>_> *blockPtrs
  ;
  
  local_29 = 0;
  local_28 = bufPtrs;
  bufPtrs_local = (vector<void_*,_std::allocator<void_*>_> *)blockLocations;
  blockLocations_local =
       (vector<deqp::gles31::bb::(anonymous_namespace)::BlockLocation,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::BlockLocation>_>
        *)layout;
  layout_local = (BufferLayout *)__return_storage_ptr__;
  sVar1 = std::
          vector<deqp::gles31::bb::(anonymous_namespace)::BlockLocation,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::BlockLocation>_>
          ::size(blockLocations);
  std::allocator<deqp::gles31::bb::BlockDataPtr>::allocator(&local_2a);
  std::vector<deqp::gles31::bb::BlockDataPtr,_std::allocator<deqp::gles31::bb::BlockDataPtr>_>::
  vector(__return_storage_ptr__,sVar1,&local_2a);
  std::allocator<deqp::gles31::bb::BlockDataPtr>::~allocator(&local_2a);
  for (blockLayout._0_4_ = 0;
      sVar1 = std::
              vector<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
              ::size((vector<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
                      *)blockLocations_local), (int)blockLayout < (int)sVar1;
      blockLayout._0_4_ = (int)blockLayout + 1) {
    blockLayout_00 =
         std::
         vector<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
         ::operator[]((vector<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
                       *)blockLocations_local,(long)(int)blockLayout);
    pvVar2 = std::
             vector<deqp::gles31::bb::(anonymous_namespace)::BlockLocation,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::BlockLocation>_>
             ::operator[]((vector<deqp::gles31::bb::(anonymous_namespace)::BlockLocation,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::BlockLocation>_>
                           *)bufPtrs_local,(long)(int)blockLayout);
    layout_00 = blockLocations_local;
    ppvVar3 = std::vector<void_*,_std::allocator<void_*>_>::operator[](local_28,(long)pvVar2->index)
    ;
    BVar5 = getBlockDataPtr((BufferLayout *)layout_00,blockLayout_00,
                            (void *)((long)*ppvVar3 + (long)pvVar2->offset),pvVar2->size);
    pvVar4 = std::
             vector<deqp::gles31::bb::BlockDataPtr,_std::allocator<deqp::gles31::bb::BlockDataPtr>_>
             ::operator[](__return_storage_ptr__,(long)(int)blockLayout);
    pvVar4->ptr = BVar5.ptr;
    pvVar4->size = BVar5.size;
    pvVar4->lastUnsizedArraySize = BVar5.lastUnsizedArraySize;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<BlockDataPtr> blockLocationsToPtrs (const BufferLayout& layout, const vector<BlockLocation>& blockLocations, const vector<void*>& bufPtrs)
{
	vector<BlockDataPtr> blockPtrs(blockLocations.size());

	DE_ASSERT(layout.blocks.size() == blockLocations.size());

	for (int blockNdx = 0; blockNdx < (int)layout.blocks.size(); blockNdx++)
	{
		const BlockLayoutEntry&	blockLayout		= layout.blocks[blockNdx];
		const BlockLocation&	location		= blockLocations[blockNdx];

		blockPtrs[blockNdx] = getBlockDataPtr(layout, blockLayout, (deUint8*)bufPtrs[location.index] + location.offset, location.size);
	}

	return blockPtrs;
}